

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::SlopesNearCollinear(IntPoint *pt1,IntPoint *pt2,IntPoint *pt3,double distSqrd)

{
  cInt cVar1;
  cInt cVar2;
  double dVar3;
  double distSqrd_local;
  IntPoint *pt3_local;
  IntPoint *pt2_local;
  IntPoint *pt1_local;
  
  cVar1 = Abs(pt1->X - pt2->X);
  cVar2 = Abs(pt1->Y - pt2->Y);
  if (cVar2 < cVar1) {
    if (pt2->X < pt1->X == pt1->X < pt3->X) {
      dVar3 = DistanceFromLineSqrd(pt1,pt2,pt3);
      pt1_local._7_1_ = dVar3 < distSqrd;
    }
    else if (pt1->X < pt2->X == pt2->X < pt3->X) {
      dVar3 = DistanceFromLineSqrd(pt2,pt1,pt3);
      pt1_local._7_1_ = dVar3 < distSqrd;
    }
    else {
      dVar3 = DistanceFromLineSqrd(pt3,pt1,pt2);
      pt1_local._7_1_ = dVar3 < distSqrd;
    }
  }
  else if (pt2->Y < pt1->Y == pt1->Y < pt3->Y) {
    dVar3 = DistanceFromLineSqrd(pt1,pt2,pt3);
    pt1_local._7_1_ = dVar3 < distSqrd;
  }
  else if (pt1->Y < pt2->Y == pt2->Y < pt3->Y) {
    dVar3 = DistanceFromLineSqrd(pt2,pt1,pt3);
    pt1_local._7_1_ = dVar3 < distSqrd;
  }
  else {
    dVar3 = DistanceFromLineSqrd(pt3,pt1,pt2);
    pt1_local._7_1_ = dVar3 < distSqrd;
  }
  return pt1_local._7_1_;
}

Assistant:

bool SlopesNearCollinear(const IntPoint& pt1, 
    const IntPoint& pt2, const IntPoint& pt3, double distSqrd)
{
  //this function is more accurate when the point that's geometrically
  //between the other 2 points is the one that's tested for distance.
  //ie makes it more likely to pick up 'spikes' ...
	if (Abs(pt1.X - pt2.X) > Abs(pt1.Y - pt2.Y))
	{
    if ((pt1.X > pt2.X) == (pt1.X < pt3.X))
      return DistanceFromLineSqrd(pt1, pt2, pt3) < distSqrd;
    else if ((pt2.X > pt1.X) == (pt2.X < pt3.X))
      return DistanceFromLineSqrd(pt2, pt1, pt3) < distSqrd;
		else
	    return DistanceFromLineSqrd(pt3, pt1, pt2) < distSqrd;
	}
	else
	{
    if ((pt1.Y > pt2.Y) == (pt1.Y < pt3.Y))
      return DistanceFromLineSqrd(pt1, pt2, pt3) < distSqrd;
    else if ((pt2.Y > pt1.Y) == (pt2.Y < pt3.Y))
      return DistanceFromLineSqrd(pt2, pt1, pt3) < distSqrd;
		else
      return DistanceFromLineSqrd(pt3, pt1, pt2) < distSqrd;
	}
}